

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGetFrameTimestampsTests.cpp
# Opt level: O0

int __thiscall
deqp::egl::anon_unknown_1::GetFrameTimestampsTests::init
          (GetFrameTimestampsTests *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *eglTestCtx;
  bool bVar1;
  int extraout_EAX;
  GetFrameTimestampTest *this_00;
  reference filters;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_60;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_58;
  iterator i;
  vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> filterLists;
  undefined1 local_28 [8];
  FilterList baseFilters;
  GetFrameTimestampsTests *this_local;
  
  baseFilters.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  eglu::FilterList::FilterList((FilterList *)local_28);
  eglu::FilterList::operator<<((FilterList *)local_28,isWindow);
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i);
  getDefaultFilterLists
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i,
             (FilterList *)local_28);
  local_58._M_current =
       (NamedFilterList *)
       std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::begin
                 ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *
                  )&i);
  while( true ) {
    local_60._M_current =
         (NamedFilterList *)
         std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::end
                   ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                     *)&i);
    bVar1 = __gnu_cxx::operator!=(&local_58,&local_60);
    if (!bVar1) break;
    this_00 = (GetFrameTimestampTest *)operator_new(0x130);
    eglTestCtx = (this->super_TestCaseGroup).m_eglTestCtx;
    filters = __gnu_cxx::
              __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
              ::operator*(&local_58);
    GetFrameTimestampTest::GetFrameTimestampTest(this_00,eglTestCtx,filters);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    __gnu_cxx::
    __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
    ::operator++(&local_58,0);
  }
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::~vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i);
  eglu::FilterList::~FilterList((FilterList *)local_28);
  return extraout_EAX;
}

Assistant:

void GetFrameTimestampsTests::init (void)
{
	eglu::FilterList baseFilters;
	baseFilters << isWindow;

	vector<NamedFilterList> filterLists;
	getDefaultFilterLists(filterLists, baseFilters);

	for (vector<NamedFilterList>::iterator i = filterLists.begin(); i != filterLists.end(); i++)
		addChild(new GetFrameTimestampTest(m_eglTestCtx, *i));
}